

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O1

void aom_hadamard_8x8_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  short sVar8;
  short sVar14;
  undefined4 uVar9;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar13 [16];
  short sVar21;
  short sVar32;
  undefined4 uVar22;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar27 [16];
  short sVar39;
  short sVar45;
  undefined4 uVar40;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar64;
  undefined4 uVar53;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar58 [16];
  short sVar71;
  short sVar95;
  undefined4 uVar72;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  undefined1 auVar77 [16];
  undefined1 auVar83 [16];
  undefined1 auVar89 [16];
  short sVar102;
  short sVar108;
  undefined4 uVar103;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar130;
  short sVar136;
  undefined4 uVar131;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar156;
  short sVar157;
  short sVar158;
  short sVar159;
  short sVar160;
  short sVar161;
  short sVar162;
  short sVar163;
  undefined1 auVar144 [16];
  undefined1 auVar150 [16];
  short sVar164;
  short sVar165;
  short sVar166;
  short sVar167;
  short sVar168;
  short sVar169;
  short sVar175;
  short sVar176;
  undefined4 uVar170;
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  short sVar193;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined6 uVar23;
  undefined1 auVar28 [16];
  undefined8 uVar24;
  undefined1 auVar29 [16];
  undefined1 auVar25 [12];
  undefined1 auVar30 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined6 uVar41;
  undefined8 uVar42;
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar59 [16];
  undefined6 uVar54;
  undefined1 auVar60 [16];
  undefined8 uVar55;
  undefined1 auVar61 [16];
  undefined1 auVar56 [12];
  undefined1 auVar62 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar78 [16];
  undefined1 auVar84 [16];
  undefined1 auVar90 [16];
  undefined6 uVar73;
  undefined1 auVar79 [16];
  undefined1 auVar85 [16];
  undefined1 auVar91 [16];
  undefined8 uVar74;
  undefined1 auVar80 [16];
  undefined1 auVar86 [16];
  undefined1 auVar92 [16];
  undefined1 auVar75 [12];
  undefined1 auVar81 [16];
  undefined1 auVar87 [16];
  undefined1 auVar93 [16];
  undefined1 auVar76 [16];
  undefined1 auVar82 [16];
  undefined1 auVar88 [16];
  undefined1 auVar94 [16];
  undefined6 uVar104;
  undefined8 uVar105;
  undefined1 auVar106 [12];
  undefined1 auVar107 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined6 uVar132;
  undefined8 uVar133;
  undefined1 auVar134 [12];
  undefined1 auVar135 [16];
  undefined1 auVar145 [16];
  undefined1 auVar151 [16];
  undefined1 auVar146 [16];
  undefined1 auVar152 [16];
  undefined1 auVar147 [16];
  undefined1 auVar153 [16];
  undefined1 auVar148 [16];
  undefined1 auVar154 [16];
  undefined1 auVar149 [16];
  undefined1 auVar155 [16];
  undefined6 uVar171;
  undefined8 uVar172;
  undefined1 auVar173 [12];
  undefined1 auVar174 [16];
  
  psVar1 = src_diff + src_stride;
  psVar2 = psVar1 + src_stride;
  psVar3 = psVar2 + src_stride;
  psVar4 = psVar3 + src_stride;
  psVar5 = psVar4 + src_stride;
  psVar6 = psVar5 + src_stride;
  psVar7 = psVar6 + src_stride;
  sVar115 = *psVar1 + *src_diff;
  sVar123 = psVar1[1] + src_diff[1];
  sVar124 = psVar1[2] + src_diff[2];
  sVar125 = psVar1[3] + src_diff[3];
  sVar126 = psVar1[4] + src_diff[4];
  sVar127 = psVar1[5] + src_diff[5];
  sVar128 = psVar1[6] + src_diff[6];
  sVar129 = psVar1[7] + src_diff[7];
  sVar8 = *src_diff - *psVar1;
  sVar14 = src_diff[1] - psVar1[1];
  sVar15 = src_diff[2] - psVar1[2];
  sVar16 = src_diff[3] - psVar1[3];
  sVar17 = src_diff[4] - psVar1[4];
  sVar18 = src_diff[5] - psVar1[5];
  sVar19 = src_diff[6] - psVar1[6];
  sVar20 = src_diff[7] - psVar1[7];
  sVar168 = *psVar3 + *psVar2;
  sVar175 = psVar3[1] + psVar2[1];
  sVar177 = psVar3[2] + psVar2[2];
  sVar179 = psVar3[3] + psVar2[3];
  sVar181 = psVar3[4] + psVar2[4];
  sVar183 = psVar3[5] + psVar2[5];
  sVar185 = psVar3[6] + psVar2[6];
  sVar187 = psVar3[7] + psVar2[7];
  sVar21 = *psVar2 - *psVar3;
  sVar32 = psVar2[1] - psVar3[1];
  sVar33 = psVar2[2] - psVar3[2];
  sVar34 = psVar2[3] - psVar3[3];
  sVar35 = psVar2[4] - psVar3[4];
  sVar36 = psVar2[5] - psVar3[5];
  sVar37 = psVar2[6] - psVar3[6];
  sVar38 = psVar2[7] - psVar3[7];
  sVar130 = *psVar5 + *psVar4;
  sVar136 = psVar5[1] + psVar4[1];
  sVar137 = psVar5[2] + psVar4[2];
  sVar138 = psVar5[3] + psVar4[3];
  sVar139 = psVar5[4] + psVar4[4];
  sVar140 = psVar5[5] + psVar4[5];
  sVar141 = psVar5[6] + psVar4[6];
  sVar142 = psVar5[7] + psVar4[7];
  sVar102 = *psVar4 - *psVar5;
  sVar108 = psVar4[1] - psVar5[1];
  sVar109 = psVar4[2] - psVar5[2];
  sVar110 = psVar4[3] - psVar5[3];
  sVar111 = psVar4[4] - psVar5[4];
  sVar112 = psVar4[5] - psVar5[5];
  sVar113 = psVar4[6] - psVar5[6];
  sVar114 = psVar4[7] - psVar5[7];
  sVar143 = *psVar7 + *psVar6;
  sVar156 = psVar7[1] + psVar6[1];
  sVar157 = psVar7[2] + psVar6[2];
  sVar158 = psVar7[3] + psVar6[3];
  sVar159 = psVar7[4] + psVar6[4];
  sVar160 = psVar7[5] + psVar6[5];
  sVar161 = psVar7[6] + psVar6[6];
  sVar162 = psVar7[7] + psVar6[7];
  sVar71 = *psVar6 - *psVar7;
  sVar95 = psVar6[1] - psVar7[1];
  sVar96 = psVar6[2] - psVar7[2];
  sVar97 = psVar6[3] - psVar7[3];
  sVar98 = psVar6[4] - psVar7[4];
  sVar99 = psVar6[5] - psVar7[5];
  sVar100 = psVar6[6] - psVar7[6];
  sVar101 = psVar6[7] - psVar7[7];
  sVar39 = sVar168 + sVar115;
  sVar45 = sVar175 + sVar123;
  sVar46 = sVar177 + sVar124;
  sVar47 = sVar179 + sVar125;
  sVar48 = sVar181 + sVar126;
  sVar49 = sVar183 + sVar127;
  sVar50 = sVar185 + sVar128;
  sVar51 = sVar187 + sVar129;
  sVar52 = sVar21 + sVar8;
  sVar64 = sVar32 + sVar14;
  sVar65 = sVar33 + sVar15;
  sVar66 = sVar34 + sVar16;
  sVar67 = sVar35 + sVar17;
  sVar68 = sVar36 + sVar18;
  sVar69 = sVar37 + sVar19;
  sVar70 = sVar38 + sVar20;
  sVar115 = sVar115 - sVar168;
  sVar123 = sVar123 - sVar175;
  sVar124 = sVar124 - sVar177;
  sVar125 = sVar125 - sVar179;
  sVar126 = sVar126 - sVar181;
  sVar127 = sVar127 - sVar183;
  sVar128 = sVar128 - sVar185;
  sVar129 = sVar129 - sVar187;
  sVar8 = sVar8 - sVar21;
  sVar14 = sVar14 - sVar32;
  sVar15 = sVar15 - sVar33;
  sVar16 = sVar16 - sVar34;
  sVar17 = sVar17 - sVar35;
  sVar18 = sVar18 - sVar36;
  sVar19 = sVar19 - sVar37;
  sVar20 = sVar20 - sVar38;
  sVar177 = sVar143 + sVar130;
  sVar179 = sVar156 + sVar136;
  sVar181 = sVar157 + sVar137;
  sVar185 = sVar158 + sVar138;
  sVar164 = sVar159 + sVar139;
  sVar165 = sVar160 + sVar140;
  sVar166 = sVar161 + sVar141;
  sVar167 = sVar162 + sVar142;
  sVar169 = sVar71 + sVar102;
  sVar176 = sVar95 + sVar108;
  sVar178 = sVar96 + sVar109;
  sVar180 = sVar97 + sVar110;
  sVar182 = sVar98 + sVar111;
  sVar184 = sVar99 + sVar112;
  sVar186 = sVar100 + sVar113;
  sVar188 = sVar101 + sVar114;
  sVar130 = sVar130 - sVar143;
  sVar136 = sVar136 - sVar156;
  sVar137 = sVar137 - sVar157;
  sVar138 = sVar138 - sVar158;
  sVar139 = sVar139 - sVar159;
  sVar140 = sVar140 - sVar160;
  sVar141 = sVar141 - sVar161;
  sVar142 = sVar142 - sVar162;
  sVar102 = sVar102 - sVar71;
  sVar108 = sVar108 - sVar95;
  sVar109 = sVar109 - sVar96;
  sVar110 = sVar110 - sVar97;
  sVar111 = sVar111 - sVar98;
  sVar112 = sVar112 - sVar99;
  sVar113 = sVar113 - sVar100;
  sVar114 = sVar114 - sVar101;
  sVar21 = sVar177 + sVar39;
  sVar35 = sVar179 + sVar45;
  sVar36 = sVar181 + sVar46;
  sVar37 = sVar185 + sVar47;
  sVar38 = sVar164 + sVar48;
  sVar71 = sVar165 + sVar49;
  sVar95 = sVar166 + sVar50;
  sVar96 = sVar167 + sVar51;
  sVar34 = sVar169 + sVar52;
  sVar168 = sVar176 + sVar64;
  sVar99 = sVar178 + sVar65;
  sVar175 = sVar180 + sVar66;
  sVar162 = sVar182 + sVar67;
  sVar183 = sVar184 + sVar68;
  sVar187 = sVar186 + sVar69;
  sVar163 = sVar188 + sVar70;
  sVar32 = sVar130 + sVar115;
  sVar189 = sVar136 + sVar123;
  sVar97 = sVar137 + sVar124;
  sVar190 = sVar138 + sVar125;
  sVar161 = sVar139 + sVar126;
  sVar191 = sVar140 + sVar127;
  sVar192 = sVar141 + sVar128;
  sVar193 = sVar142 + sVar129;
  sVar33 = sVar102 + sVar8;
  sVar143 = sVar108 + sVar14;
  sVar98 = sVar109 + sVar15;
  sVar156 = sVar110 + sVar16;
  sVar157 = sVar111 + sVar17;
  sVar158 = sVar112 + sVar18;
  sVar159 = sVar113 + sVar19;
  sVar160 = sVar114 + sVar20;
  sVar39 = sVar39 - sVar177;
  sVar45 = sVar45 - sVar179;
  sVar46 = sVar46 - sVar181;
  sVar47 = sVar47 - sVar185;
  sVar48 = sVar48 - sVar164;
  sVar49 = sVar49 - sVar165;
  sVar50 = sVar50 - sVar166;
  sVar51 = sVar51 - sVar167;
  sVar52 = sVar52 - sVar169;
  sVar64 = sVar64 - sVar176;
  sVar65 = sVar65 - sVar178;
  sVar66 = sVar66 - sVar180;
  sVar67 = sVar67 - sVar182;
  sVar68 = sVar68 - sVar184;
  sVar69 = sVar69 - sVar186;
  sVar70 = sVar70 - sVar188;
  sVar115 = sVar115 - sVar130;
  sVar123 = sVar123 - sVar136;
  sVar124 = sVar124 - sVar137;
  sVar125 = sVar125 - sVar138;
  sVar126 = sVar126 - sVar139;
  sVar127 = sVar127 - sVar140;
  sVar128 = sVar128 - sVar141;
  sVar129 = sVar129 - sVar142;
  sVar8 = sVar8 - sVar102;
  sVar14 = sVar14 - sVar108;
  sVar15 = sVar15 - sVar109;
  sVar16 = sVar16 - sVar110;
  sVar17 = sVar17 - sVar111;
  sVar18 = sVar18 - sVar112;
  sVar19 = sVar19 - sVar113;
  sVar20 = sVar20 - sVar114;
  sVar100 = sVar35 + sVar21;
  sVar101 = sVar123 + sVar115;
  sVar102 = sVar45 + sVar39;
  sVar108 = sVar189 + sVar32;
  sVar109 = sVar143 + sVar33;
  sVar110 = sVar14 + sVar8;
  sVar111 = sVar64 + sVar52;
  sVar112 = sVar168 + sVar34;
  sVar21 = sVar21 - sVar35;
  sVar115 = sVar115 - sVar123;
  sVar39 = sVar39 - sVar45;
  sVar32 = sVar32 - sVar189;
  sVar33 = sVar33 - sVar143;
  sVar8 = sVar8 - sVar14;
  sVar52 = sVar52 - sVar64;
  sVar34 = sVar34 - sVar168;
  sVar130 = sVar37 + sVar36;
  sVar136 = sVar125 + sVar124;
  sVar137 = sVar47 + sVar46;
  sVar138 = sVar190 + sVar97;
  sVar139 = sVar156 + sVar98;
  sVar140 = sVar16 + sVar15;
  sVar141 = sVar66 + sVar65;
  sVar142 = sVar175 + sVar99;
  sVar36 = sVar36 - sVar37;
  sVar124 = sVar124 - sVar125;
  sVar46 = sVar46 - sVar47;
  sVar97 = sVar97 - sVar190;
  sVar98 = sVar98 - sVar156;
  sVar15 = sVar15 - sVar16;
  sVar65 = sVar65 - sVar66;
  sVar99 = sVar99 - sVar175;
  sVar168 = sVar71 + sVar38;
  sVar175 = sVar127 + sVar126;
  sVar177 = sVar49 + sVar48;
  sVar179 = sVar191 + sVar161;
  sVar181 = sVar158 + sVar157;
  sVar185 = sVar18 + sVar17;
  sVar164 = sVar68 + sVar67;
  sVar165 = sVar183 + sVar162;
  sVar38 = sVar38 - sVar71;
  sVar126 = sVar126 - sVar127;
  sVar48 = sVar48 - sVar49;
  sVar161 = sVar161 - sVar191;
  sVar157 = sVar157 - sVar158;
  sVar17 = sVar17 - sVar18;
  sVar67 = sVar67 - sVar68;
  sVar162 = sVar162 - sVar183;
  sVar45 = sVar96 + sVar95;
  sVar156 = sVar129 + sVar128;
  sVar158 = sVar51 + sVar50;
  sVar113 = sVar193 + sVar192;
  sVar114 = sVar160 + sVar159;
  sVar123 = sVar20 + sVar19;
  sVar125 = sVar70 + sVar69;
  sVar127 = sVar163 + sVar187;
  sVar95 = sVar95 - sVar96;
  sVar128 = sVar128 - sVar129;
  sVar50 = sVar50 - sVar51;
  sVar192 = sVar192 - sVar193;
  sVar159 = sVar159 - sVar160;
  sVar19 = sVar19 - sVar20;
  sVar69 = sVar69 - sVar70;
  sVar187 = sVar187 - sVar163;
  sVar47 = sVar130 + sVar100;
  sVar49 = sVar136 + sVar101;
  sVar51 = sVar137 + sVar102;
  sVar64 = sVar138 + sVar108;
  sVar66 = sVar139 + sVar109;
  sVar68 = sVar140 + sVar110;
  sVar70 = sVar141 + sVar111;
  sVar143 = sVar142 + sVar112;
  sVar14 = sVar36 + sVar21;
  sVar16 = sVar124 + sVar115;
  sVar18 = sVar46 + sVar39;
  sVar20 = sVar97 + sVar32;
  sVar35 = sVar98 + sVar33;
  sVar37 = sVar15 + sVar8;
  sVar71 = sVar65 + sVar52;
  sVar96 = sVar99 + sVar34;
  sVar100 = sVar100 - sVar130;
  sVar101 = sVar101 - sVar136;
  sVar102 = sVar102 - sVar137;
  sVar108 = sVar108 - sVar138;
  sVar109 = sVar109 - sVar139;
  sVar110 = sVar110 - sVar140;
  sVar111 = sVar111 - sVar141;
  sVar112 = sVar112 - sVar142;
  sVar21 = sVar21 - sVar36;
  sVar115 = sVar115 - sVar124;
  sVar39 = sVar39 - sVar46;
  sVar32 = sVar32 - sVar97;
  sVar33 = sVar33 - sVar98;
  sVar8 = sVar8 - sVar15;
  sVar52 = sVar52 - sVar65;
  sVar34 = sVar34 - sVar99;
  sVar160 = sVar45 + sVar168;
  sVar129 = sVar156 + sVar175;
  sVar130 = sVar158 + sVar177;
  sVar136 = sVar113 + sVar179;
  sVar137 = sVar114 + sVar181;
  sVar138 = sVar123 + sVar185;
  sVar139 = sVar125 + sVar164;
  sVar140 = sVar127 + sVar165;
  sVar141 = sVar95 + sVar38;
  sVar142 = sVar128 + sVar126;
  sVar183 = sVar50 + sVar48;
  sVar163 = sVar192 + sVar161;
  sVar166 = sVar159 + sVar157;
  sVar167 = sVar19 + sVar17;
  sVar169 = sVar69 + sVar67;
  sVar176 = sVar187 + sVar162;
  sVar168 = sVar168 - sVar45;
  sVar175 = sVar175 - sVar156;
  sVar177 = sVar177 - sVar158;
  sVar179 = sVar179 - sVar113;
  sVar181 = sVar181 - sVar114;
  sVar185 = sVar185 - sVar123;
  sVar164 = sVar164 - sVar125;
  sVar165 = sVar165 - sVar127;
  sVar38 = sVar38 - sVar95;
  sVar126 = sVar126 - sVar128;
  sVar48 = sVar48 - sVar50;
  sVar161 = sVar161 - sVar192;
  sVar157 = sVar157 - sVar159;
  sVar17 = sVar17 - sVar19;
  sVar67 = sVar67 - sVar69;
  sVar162 = sVar162 - sVar187;
  sVar159 = sVar160 + sVar47;
  sVar113 = sVar129 + sVar49;
  uVar170 = CONCAT22(sVar113,sVar159);
  sVar114 = sVar130 + sVar51;
  uVar171 = CONCAT24(sVar114,uVar170);
  sVar123 = sVar136 + sVar64;
  uVar172 = CONCAT26(sVar123,uVar171);
  sVar125 = sVar137 + sVar66;
  auVar173._0_10_ = CONCAT28(sVar125,uVar172);
  auVar173._10_2_ = sVar138 + sVar68;
  auVar174._12_2_ = sVar139 + sVar70;
  auVar174._0_12_ = auVar173;
  auVar174._14_2_ = sVar140 + sVar143;
  sVar15 = sVar141 + sVar14;
  sVar19 = sVar142 + sVar16;
  uVar40 = CONCAT22(sVar19,sVar15);
  sVar36 = sVar183 + sVar18;
  uVar41 = CONCAT24(sVar36,uVar40);
  sVar95 = sVar163 + sVar20;
  uVar42 = CONCAT26(sVar95,uVar41);
  sVar45 = sVar166 + sVar35;
  auVar43._0_10_ = CONCAT28(sVar45,uVar42);
  auVar43._10_2_ = sVar167 + sVar37;
  auVar44._12_2_ = sVar169 + sVar71;
  auVar44._0_12_ = auVar43;
  auVar44._14_2_ = sVar176 + sVar96;
  sVar65 = sVar168 + sVar100;
  sVar99 = sVar175 + sVar101;
  uVar131 = CONCAT22(sVar99,sVar65);
  sVar69 = sVar177 + sVar102;
  uVar132 = CONCAT24(sVar69,uVar131);
  sVar156 = sVar179 + sVar108;
  uVar133 = CONCAT26(sVar156,uVar132);
  sVar158 = sVar181 + sVar109;
  auVar134._0_10_ = CONCAT28(sVar158,uVar133);
  auVar134._10_2_ = sVar185 + sVar110;
  auVar135._12_2_ = sVar164 + sVar111;
  auVar135._0_12_ = auVar134;
  auVar135._14_2_ = sVar165 + sVar112;
  sVar124 = sVar38 + sVar21;
  sVar46 = sVar126 + sVar115;
  uVar103 = CONCAT22(sVar46,sVar124);
  sVar97 = sVar48 + sVar39;
  uVar104 = CONCAT24(sVar97,uVar103);
  sVar98 = sVar161 + sVar32;
  uVar105 = CONCAT26(sVar98,uVar104);
  sVar50 = sVar157 + sVar33;
  auVar106._0_10_ = CONCAT28(sVar50,uVar105);
  auVar106._10_2_ = sVar17 + sVar8;
  auVar107._12_2_ = sVar67 + sVar52;
  auVar107._0_12_ = auVar106;
  auVar107._14_2_ = sVar162 + sVar34;
  sVar47 = sVar47 - sVar160;
  sVar49 = sVar49 - sVar129;
  uVar72 = CONCAT22(sVar49,sVar47);
  sVar51 = sVar51 - sVar130;
  uVar73 = CONCAT24(sVar51,uVar72);
  sVar64 = sVar64 - sVar136;
  uVar74 = CONCAT26(sVar64,uVar73);
  sVar66 = sVar66 - sVar137;
  auVar75._0_10_ = CONCAT28(sVar66,uVar74);
  auVar75._10_2_ = sVar68 - sVar138;
  auVar76._12_2_ = sVar70 - sVar139;
  auVar76._0_12_ = auVar75;
  auVar76._14_2_ = sVar143 - sVar140;
  sVar14 = sVar14 - sVar141;
  sVar16 = sVar16 - sVar142;
  uVar22 = CONCAT22(sVar16,sVar14);
  sVar18 = sVar18 - sVar183;
  uVar23 = CONCAT24(sVar18,uVar22);
  sVar20 = sVar20 - sVar163;
  uVar24 = CONCAT26(sVar20,uVar23);
  sVar35 = sVar35 - sVar166;
  auVar25._0_10_ = CONCAT28(sVar35,uVar24);
  auVar25._10_2_ = sVar37 - sVar167;
  auVar26._12_2_ = sVar71 - sVar169;
  auVar26._0_12_ = auVar25;
  auVar26._14_2_ = sVar96 - sVar176;
  sVar100 = sVar100 - sVar168;
  sVar101 = sVar101 - sVar175;
  uVar53 = CONCAT22(sVar101,sVar100);
  sVar102 = sVar102 - sVar177;
  uVar54 = CONCAT24(sVar102,uVar53);
  sVar108 = sVar108 - sVar179;
  uVar55 = CONCAT26(sVar108,uVar54);
  sVar109 = sVar109 - sVar181;
  auVar56._0_10_ = CONCAT28(sVar109,uVar55);
  auVar56._10_2_ = sVar110 - sVar185;
  auVar57._12_2_ = sVar111 - sVar164;
  auVar57._0_12_ = auVar56;
  auVar57._14_2_ = sVar112 - sVar165;
  sVar21 = sVar21 - sVar38;
  sVar115 = sVar115 - sVar126;
  uVar9 = CONCAT22(sVar115,sVar21);
  sVar39 = sVar39 - sVar48;
  uVar10 = CONCAT24(sVar39,uVar9);
  sVar32 = sVar32 - sVar161;
  uVar11 = CONCAT26(sVar32,uVar10);
  sVar33 = sVar33 - sVar157;
  auVar12._0_10_ = CONCAT28(sVar33,uVar11);
  auVar12._10_2_ = sVar8 - sVar17;
  auVar13._12_2_ = sVar52 - sVar67;
  auVar13._0_12_ = auVar12;
  auVar13._14_2_ = sVar34 - sVar162;
  auVar116 = psraw(auVar174,0xf);
  auVar149._12_2_ = sVar123;
  auVar149._0_12_ = auVar173;
  auVar149._14_2_ = auVar116._6_2_;
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._10_2_ = auVar116._4_2_;
  auVar148._0_10_ = auVar173._0_10_;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = sVar114;
  auVar147._0_8_ = uVar172;
  auVar146._8_8_ = auVar147._8_8_;
  auVar146._6_2_ = auVar116._2_2_;
  auVar146._0_6_ = uVar171;
  auVar145._6_10_ = auVar146._6_10_;
  auVar145._4_2_ = sVar113;
  auVar145._0_4_ = uVar170;
  auVar144._4_12_ = auVar145._4_12_;
  auVar144._2_2_ = auVar116._0_2_;
  auVar144._0_2_ = sVar159;
  *(undefined1 (*) [16])coeff = auVar144;
  *(short *)(coeff + 4) = sVar125;
  *(short *)((long)coeff + 0x12) = auVar116._8_2_;
  *(short *)(coeff + 5) = auVar173._10_2_;
  *(short *)((long)coeff + 0x16) = auVar116._10_2_;
  *(short *)(coeff + 6) = auVar174._12_2_;
  *(short *)((long)coeff + 0x1a) = auVar116._12_2_;
  *(short *)(coeff + 7) = auVar174._14_2_;
  *(short *)((long)coeff + 0x1e) = auVar116._14_2_;
  auVar116 = psraw(auVar57,0xf);
  auVar155._12_2_ = sVar108;
  auVar155._0_12_ = auVar56;
  auVar155._14_2_ = auVar116._6_2_;
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._10_2_ = auVar116._4_2_;
  auVar154._0_10_ = auVar56._0_10_;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = sVar102;
  auVar153._0_8_ = uVar55;
  auVar152._8_8_ = auVar153._8_8_;
  auVar152._6_2_ = auVar116._2_2_;
  auVar152._0_6_ = uVar54;
  auVar151._6_10_ = auVar152._6_10_;
  auVar151._4_2_ = sVar101;
  auVar151._0_4_ = uVar53;
  auVar150._4_12_ = auVar151._4_12_;
  auVar150._2_2_ = auVar116._0_2_;
  auVar150._0_2_ = sVar100;
  *(undefined1 (*) [16])(coeff + 8) = auVar150;
  *(short *)(coeff + 0xc) = sVar109;
  *(short *)((long)coeff + 0x32) = auVar116._8_2_;
  *(short *)(coeff + 0xd) = auVar56._10_2_;
  *(short *)((long)coeff + 0x36) = auVar116._10_2_;
  *(short *)(coeff + 0xe) = auVar57._12_2_;
  *(short *)((long)coeff + 0x3a) = auVar116._12_2_;
  *(short *)(coeff + 0xf) = auVar57._14_2_;
  *(short *)((long)coeff + 0x3e) = auVar116._14_2_;
  auVar116 = psraw(auVar76,0xf);
  auVar122._12_2_ = sVar64;
  auVar122._0_12_ = auVar75;
  auVar122._14_2_ = auVar116._6_2_;
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._10_2_ = auVar116._4_2_;
  auVar121._0_10_ = auVar75._0_10_;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = sVar51;
  auVar120._0_8_ = uVar74;
  auVar119._8_8_ = auVar120._8_8_;
  auVar119._6_2_ = auVar116._2_2_;
  auVar119._0_6_ = uVar73;
  auVar118._6_10_ = auVar119._6_10_;
  auVar118._4_2_ = sVar49;
  auVar118._0_4_ = uVar72;
  auVar117._4_12_ = auVar118._4_12_;
  auVar117._2_2_ = auVar116._0_2_;
  auVar117._0_2_ = sVar47;
  *(undefined1 (*) [16])(coeff + 0x10) = auVar117;
  *(short *)(coeff + 0x14) = sVar66;
  *(short *)((long)coeff + 0x52) = auVar116._8_2_;
  *(short *)(coeff + 0x15) = auVar75._10_2_;
  *(short *)((long)coeff + 0x56) = auVar116._10_2_;
  *(short *)(coeff + 0x16) = auVar76._12_2_;
  *(short *)((long)coeff + 0x5a) = auVar116._12_2_;
  *(short *)(coeff + 0x17) = auVar76._14_2_;
  *(short *)((long)coeff + 0x5e) = auVar116._14_2_;
  auVar116 = psraw(auVar135,0xf);
  auVar82._12_2_ = sVar156;
  auVar82._0_12_ = auVar134;
  auVar82._14_2_ = auVar116._6_2_;
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._10_2_ = auVar116._4_2_;
  auVar81._0_10_ = auVar134._0_10_;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = sVar69;
  auVar80._0_8_ = uVar133;
  auVar79._8_8_ = auVar80._8_8_;
  auVar79._6_2_ = auVar116._2_2_;
  auVar79._0_6_ = uVar132;
  auVar78._6_10_ = auVar79._6_10_;
  auVar78._4_2_ = sVar99;
  auVar78._0_4_ = uVar131;
  auVar77._4_12_ = auVar78._4_12_;
  auVar77._2_2_ = auVar116._0_2_;
  auVar77._0_2_ = sVar65;
  *(undefined1 (*) [16])(coeff + 0x18) = auVar77;
  *(short *)(coeff + 0x1c) = sVar158;
  *(short *)((long)coeff + 0x72) = auVar116._8_2_;
  *(short *)(coeff + 0x1d) = auVar134._10_2_;
  *(short *)((long)coeff + 0x76) = auVar116._10_2_;
  *(short *)(coeff + 0x1e) = auVar135._12_2_;
  *(short *)((long)coeff + 0x7a) = auVar116._12_2_;
  *(short *)(coeff + 0x1f) = auVar135._14_2_;
  *(short *)((long)coeff + 0x7e) = auVar116._14_2_;
  auVar116 = psraw(auVar107,0xf);
  auVar88._12_2_ = sVar98;
  auVar88._0_12_ = auVar106;
  auVar88._14_2_ = auVar116._6_2_;
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._10_2_ = auVar116._4_2_;
  auVar87._0_10_ = auVar106._0_10_;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = sVar97;
  auVar86._0_8_ = uVar105;
  auVar85._8_8_ = auVar86._8_8_;
  auVar85._6_2_ = auVar116._2_2_;
  auVar85._0_6_ = uVar104;
  auVar84._6_10_ = auVar85._6_10_;
  auVar84._4_2_ = sVar46;
  auVar84._0_4_ = uVar103;
  auVar83._4_12_ = auVar84._4_12_;
  auVar83._2_2_ = auVar116._0_2_;
  auVar83._0_2_ = sVar124;
  *(undefined1 (*) [16])(coeff + 0x20) = auVar83;
  *(short *)(coeff + 0x24) = sVar50;
  *(short *)((long)coeff + 0x92) = auVar116._8_2_;
  *(short *)(coeff + 0x25) = auVar106._10_2_;
  *(short *)((long)coeff + 0x96) = auVar116._10_2_;
  *(short *)(coeff + 0x26) = auVar107._12_2_;
  *(short *)((long)coeff + 0x9a) = auVar116._12_2_;
  *(short *)(coeff + 0x27) = auVar107._14_2_;
  *(short *)((long)coeff + 0x9e) = auVar116._14_2_;
  auVar116 = psraw(auVar13,0xf);
  auVar94._12_2_ = sVar32;
  auVar94._0_12_ = auVar12;
  auVar94._14_2_ = auVar116._6_2_;
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._10_2_ = auVar116._4_2_;
  auVar93._0_10_ = auVar12._0_10_;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = sVar39;
  auVar92._0_8_ = uVar11;
  auVar91._8_8_ = auVar92._8_8_;
  auVar91._6_2_ = auVar116._2_2_;
  auVar91._0_6_ = uVar10;
  auVar90._6_10_ = auVar91._6_10_;
  auVar90._4_2_ = sVar115;
  auVar90._0_4_ = uVar9;
  auVar89._4_12_ = auVar90._4_12_;
  auVar89._2_2_ = auVar116._0_2_;
  auVar89._0_2_ = sVar21;
  *(undefined1 (*) [16])(coeff + 0x28) = auVar89;
  *(short *)(coeff + 0x2c) = sVar33;
  *(short *)((long)coeff + 0xb2) = auVar116._8_2_;
  *(short *)(coeff + 0x2d) = auVar12._10_2_;
  *(short *)((long)coeff + 0xb6) = auVar116._10_2_;
  *(short *)(coeff + 0x2e) = auVar13._12_2_;
  *(short *)((long)coeff + 0xba) = auVar116._12_2_;
  *(short *)(coeff + 0x2f) = auVar13._14_2_;
  *(short *)((long)coeff + 0xbe) = auVar116._14_2_;
  auVar13 = psraw(auVar26,0xf);
  auVar63._12_2_ = sVar20;
  auVar63._0_12_ = auVar25;
  auVar63._14_2_ = auVar13._6_2_;
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._10_2_ = auVar13._4_2_;
  auVar62._0_10_ = auVar25._0_10_;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = sVar18;
  auVar61._0_8_ = uVar24;
  auVar60._8_8_ = auVar61._8_8_;
  auVar60._6_2_ = auVar13._2_2_;
  auVar60._0_6_ = uVar23;
  auVar59._6_10_ = auVar60._6_10_;
  auVar59._4_2_ = sVar16;
  auVar59._0_4_ = uVar22;
  auVar58._4_12_ = auVar59._4_12_;
  auVar58._2_2_ = auVar13._0_2_;
  auVar58._0_2_ = sVar14;
  *(undefined1 (*) [16])(coeff + 0x30) = auVar58;
  *(short *)(coeff + 0x34) = sVar35;
  *(short *)((long)coeff + 0xd2) = auVar13._8_2_;
  *(short *)(coeff + 0x35) = auVar25._10_2_;
  *(short *)((long)coeff + 0xd6) = auVar13._10_2_;
  *(short *)(coeff + 0x36) = auVar26._12_2_;
  *(short *)((long)coeff + 0xda) = auVar13._12_2_;
  *(short *)(coeff + 0x37) = auVar26._14_2_;
  *(short *)((long)coeff + 0xde) = auVar13._14_2_;
  auVar13 = psraw(auVar44,0xf);
  auVar31._12_2_ = sVar95;
  auVar31._0_12_ = auVar43;
  auVar31._14_2_ = auVar13._6_2_;
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._10_2_ = auVar13._4_2_;
  auVar30._0_10_ = auVar43._0_10_;
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._8_2_ = sVar36;
  auVar29._0_8_ = uVar42;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._6_2_ = auVar13._2_2_;
  auVar28._0_6_ = uVar41;
  auVar27._6_10_ = auVar28._6_10_;
  auVar27._4_2_ = sVar19;
  auVar27._0_4_ = uVar40;
  auVar116._4_12_ = auVar27._4_12_;
  auVar116._2_2_ = auVar13._0_2_;
  auVar116._0_2_ = sVar15;
  *(undefined1 (*) [16])(coeff + 0x38) = auVar116;
  *(short *)(coeff + 0x3c) = sVar45;
  *(short *)((long)coeff + 0xf2) = auVar13._8_2_;
  *(short *)(coeff + 0x3d) = auVar43._10_2_;
  *(short *)((long)coeff + 0xf6) = auVar13._10_2_;
  *(short *)(coeff + 0x3e) = auVar44._12_2_;
  *(short *)((long)coeff + 0xfa) = auVar13._12_2_;
  *(short *)(coeff + 0x3f) = auVar44._14_2_;
  *(short *)((long)coeff + 0xfe) = auVar13._14_2_;
  return;
}

Assistant:

static inline void hadamard_8x8_sse2(const int16_t *src_diff,
                                     ptrdiff_t src_stride, tran_low_t *coeff,
                                     int is_final) {
  __m128i src[8];
  src[0] = _mm_load_si128((const __m128i *)src_diff);
  src[1] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[4] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[5] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[6] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[7] = _mm_load_si128((const __m128i *)(src_diff + src_stride));

  hadamard_col8_sse2(src, 0);
  hadamard_col8_sse2(src, 1);

  if (is_final) {
    store_tran_low(src[0], coeff);
    coeff += 8;
    store_tran_low(src[1], coeff);
    coeff += 8;
    store_tran_low(src[2], coeff);
    coeff += 8;
    store_tran_low(src[3], coeff);
    coeff += 8;
    store_tran_low(src[4], coeff);
    coeff += 8;
    store_tran_low(src[5], coeff);
    coeff += 8;
    store_tran_low(src[6], coeff);
    coeff += 8;
    store_tran_low(src[7], coeff);
  } else {
    int16_t *coeff16 = (int16_t *)coeff;
    _mm_store_si128((__m128i *)coeff16, src[0]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[1]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[2]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[3]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[4]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[5]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[6]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[7]);
  }
}